

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O3

_Bool mips_cpu_tlb_fill_mips
                (CPUState *cs,vaddr address,int size,MMUAccessType access_type,int mmu_idx,
                _Bool probe,uintptr_t retaddr)

{
  uint *puVar1;
  undefined4 uVar2;
  _Bool _Var3;
  int tlb_error;
  uint uVar4;
  uint uVar5;
  sbyte sVar6;
  sbyte sVar7;
  byte bVar8;
  byte bVar9;
  uint uVar10;
  byte bVar11;
  int iVar12;
  target_ulong_conflict real_address;
  uint uVar13;
  int iVar14;
  uint uVar15;
  undefined7 in_register_00000089;
  ulong uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  target_ulong_conflict tmp_entryhi;
  CPUMIPSState *env;
  ulong uVar20;
  int prot;
  uint64_t pw_entrylo1;
  uint64_t pw_entrylo0;
  hwaddr physical;
  uint64_t paddr;
  int in_stack_ffffffffffffff18;
  TranslationBlock **ppTVar21;
  _Bool local_e0;
  _Bool local_df;
  _Bool local_de;
  _Bool local_dd;
  uint local_dc;
  CPUMIPSState *local_d8;
  uint local_cc;
  uint local_c8;
  int local_c4;
  ulong local_c0;
  TranslationBlock *local_b8;
  TranslationBlock *local_b0;
  uint local_a4;
  uint local_a0;
  uint local_9c;
  uint local_98;
  MMUAccessType local_94;
  TranslationBlock *local_90;
  uint local_88 [2];
  uint local_80;
  uint local_7c;
  uint local_78;
  int local_74;
  undefined4 local_70;
  int local_6c;
  undefined8 local_68;
  TranslationBlock *pTStack_60;
  ulong local_50;
  ulong local_48;
  hwaddr local_40;
  uint local_34;
  
  local_70 = (undefined4)CONCAT71(in_register_00000089,probe);
  env = (CPUMIPSState *)(cs[1].tb_jmp_cache + 0x13f);
  real_address = (target_ulong_conflict)address;
  tlb_error = get_physical_address
                        (env,(hwaddr *)local_88,&local_c4,real_address,access_type,mmu_idx,
                         in_stack_ffffffffffffff18);
  if (tlb_error == -2) {
    tlb_error = -2;
    if ((uint)cs[1].tb_jmp_cache[0x6b8]->pc < 2) goto LAB_0075582a;
    uVar5 = *(uint *)((long)cs[1].tb_jmp_cache + 0x358c);
    *(uint *)((long)cs[1].tb_jmp_cache + 0x358c) = uVar5 & 0xfffffffc;
    uVar10 = *(uint *)((long)cs[1].tb_jmp_cache + 0xec4);
    uVar4 = uVar10 >> 0x18 & 0x3f;
    local_98 = uVar10 >> 0xc & 0x3f;
    uVar13 = uVar10 & 0x3f;
    local_e0 = false;
    local_dd = false;
    local_de = false;
    local_df = false;
    local_b0 = (TranslationBlock *)0x0;
    local_b8 = (TranslationBlock *)0x0;
    iVar14 = ((uVar10 >> 0x1e & 1) != 0) + 2;
    uVar17 = *(uint *)(cs[1].tb_jmp_cache + 0x1d8);
    local_48 = (ulong)uVar17;
    local_78 = uVar17 >> 0x18;
    local_9c = local_78 & 0x3f;
    local_7c = uVar17 >> 0x12;
    local_a0 = local_7c & 0x3f;
    sVar6 = (sbyte)local_a0;
    local_80 = uVar17 >> 0xc;
    local_68 = (TranslationBlock *)(CONCAT44(local_68._4_4_,uVar10 >> 0x12) & 0xffffffff0000003f);
    local_a4 = local_80 & 0x3f;
    sVar7 = (sbyte)local_a4;
    bVar9 = (byte)local_98;
    uVar17 = uVar17 >> 6 & 0x3f;
    iVar12 = -1;
    if (uVar13 < 2) {
      iVar12 = (uint)(uVar13 == 1 & *(byte *)((long)cs[1].tb_jmp_cache + 0xecc) >> 6) + iVar14;
    }
    local_dc = uVar5 & 3;
    bVar8 = (byte)iVar12;
    uVar16 = 0xff;
    if (uVar13 < 2) {
      uVar16 = (ulong)(iVar14 + (uint)(uVar13 == 1));
    }
    uVar19 = (((uint)(address >> (sbyte)uVar17) & ~(-1 << ((byte)(uVar10 >> 6) & 0x1f))) >> 1) <<
             ((char)uVar16 + 1U & 0x1f);
    uVar15 = 1 << ((char)uVar16 + 3U & 0x1f);
    uVar18 = local_dc;
    local_d8 = env;
    local_94 = access_type;
    local_74 = mmu_idx;
    if (((((*(byte *)((long)cs[1].tb_jmp_cache + 0xf6b) & 1) != 0) &&
         (*(int *)((long)cs[1].tb_jmp_cache + 0xecc) < 0)) &&
        ((uVar4 != 0 || (int)local_68 != 0) || local_98 != 0)) && ((uVar13 < 2 && (iVar12 != -1))))
    {
      uVar20 = (ulong)*(uint *)((long)cs[1].tb_jmp_cache + 0xebc);
      local_cc = uVar17;
      local_c8 = uVar15;
      local_50 = uVar16;
      if (uVar4 == 0) {
LAB_007558d6:
        if ((int)local_68 != 0) {
          local_c0 = uVar20 | (long)(int)(((uint)(address >> sVar6) &
                                          ~(-1 << ((byte)(uVar10 >> 0x12) & 0x1f))) <<
                                         (bVar8 & 0x1f));
          ppTVar21 = &local_b8;
          iVar12 = walk_directory(local_d8,&local_c0,local_a0,&local_e0,&local_de,
                                  (uint64_t *)&local_b0,(uint64_t *)ppTVar21);
          in_stack_ffffffffffffff18 = (int)ppTVar21;
          bVar11 = (byte)local_cc;
          uVar18 = local_dc;
          uVar5 = local_dc;
          if (iVar12 == 0) goto LAB_00755819;
          uVar20 = local_c0;
          if (iVar12 == 1) goto LAB_00755984;
        }
        if (local_98 != 0) {
          local_c0 = uVar20 | (long)(int)(((uint)(address >> sVar7) & ~(-1 << (bVar9 & 0x1f))) <<
                                         (bVar8 & 0x1f));
          ppTVar21 = &local_b8;
          iVar12 = walk_directory(local_d8,&local_c0,local_a4,&local_e0,&local_df,
                                  (uint64_t *)&local_b0,(uint64_t *)ppTVar21);
          in_stack_ffffffffffffff18 = (int)ppTVar21;
          bVar11 = (byte)local_cc;
          uVar18 = local_dc;
          uVar5 = local_dc;
          if (iVar12 == 0) goto LAB_00755819;
          uVar20 = local_c0;
          if (iVar12 == 1) goto LAB_00755984;
        }
        uVar20 = (long)(int)uVar19 | uVar20;
        uVar5 = *(uint *)((long)cs[1].tb_jmp_cache + 0x358c);
        uVar10 = 3;
        if ((uVar5 >> 0x1c & 1) == 0) {
          uVar10 = uVar5 & 3;
        }
        iVar12 = get_physical_address
                           (local_d8,&local_40,&local_6c,(target_ulong_conflict)uVar20,0,uVar10,
                            in_stack_ffffffffffffff18);
        uVar18 = local_dc;
        uVar5 = local_dc;
        if ((iVar12 == 0) &&
           (_Var3 = get_pte(local_d8,uVar20,local_c8,(uint64_t *)&local_90), uVar18 = local_dc,
           uVar5 = local_dc, _Var3)) {
          uVar10 = (uint)local_48 & 0x3f;
          uVar5 = uVar10 - 0x20;
          if (uVar10 <= local_c8) {
            uVar5 = uVar10;
          }
          bVar9 = (char)uVar5 - 2;
          uVar16 = (ulong)local_90 >> (bVar9 & 0x3f);
          local_b0 = (TranslationBlock *)((ulong)(uint)((int)uVar16 << 0x1e) | uVar16 >> 2);
          uVar20 = uVar20 | (long)(int)(uVar19 | 1 << ((uint)local_50 & 0x1f));
          uVar5 = *(uint *)((long)cs[1].tb_jmp_cache + 0x358c);
          uVar10 = 3;
          if ((uVar5 >> 0x1c & 1) == 0) {
            uVar10 = uVar5 & 3;
          }
          local_90 = local_b0;
          iVar12 = get_physical_address
                             (local_d8,&local_40,&local_6c,(target_ulong_conflict)uVar20,0,uVar10,
                              in_stack_ffffffffffffff18);
          uVar18 = local_dc;
          uVar5 = local_dc;
          if (iVar12 == 0) {
            _Var3 = get_pte(local_d8,uVar20,local_c8,(uint64_t *)&local_90);
            bVar11 = (byte)local_cc;
            uVar18 = local_dc;
            uVar5 = local_dc;
            if (_Var3) {
              uVar16 = (ulong)local_90 >> (bVar9 & 0x3f);
              local_b8 = (TranslationBlock *)((ulong)(uint)((int)uVar16 << 0x1e) | uVar16 >> 2);
              goto LAB_00755984;
            }
          }
        }
      }
      else {
        local_c0 = uVar20 | (long)(int)(((uint)(address >> (sbyte)local_9c) &
                                        ~(-1 << ((byte)uVar4 & 0x1f))) << (bVar8 & 0x1f));
        ppTVar21 = &local_b8;
        iVar12 = walk_directory(env,&local_c0,local_9c,&local_e0,&local_dd,(uint64_t *)&local_b0,
                                (uint64_t *)ppTVar21);
        in_stack_ffffffffffffff18 = (int)ppTVar21;
        bVar11 = (byte)local_cc;
        uVar18 = local_dc;
        uVar5 = local_dc;
        if (iVar12 != 0) {
          uVar20 = local_c0;
          if (iVar12 != 1) goto LAB_007558d6;
LAB_00755984:
          env = local_d8;
          local_34 = ~(-1 << (bVar11 & 0x1f));
          if (local_e0 == true) {
            uVar5 = (uint)local_df | (uint)local_dd * 4 + (uint)local_de * 2;
            if (uVar5 == 1) {
              local_34 = ~(-1 << ((byte)local_a4 & 0x1f));
              bVar9 = (byte)local_80;
            }
            else if (uVar5 == 2) {
              local_34 = ~(-1 << ((byte)local_a0 & 0x1f));
              bVar9 = (byte)local_7c;
            }
            else {
              if (uVar5 != 4) goto LAB_00755b59;
              local_34 = ~(-1 << ((byte)local_9c & 0x1f));
              bVar9 = (byte)local_78;
            }
            local_34 = local_34 >> (bVar9 & 1);
          }
LAB_00755b59:
          local_34 = local_34 >> 0xc;
          update_pagemask_mips(local_d8,local_34 << 0xd,(int32_t *)&local_34);
          uVar5 = *(uint *)(cs[1].tb_jmp_cache + 0x1e5);
          uVar2 = *(undefined4 *)((long)cs[1].tb_jmp_cache + 0xea4);
          *(target_ulong_conflict *)(cs[1].tb_jmp_cache + 0x1e5) =
               real_address & 0xffffe000 | uVar5 & 0xff;
          *(uint *)((long)cs[1].tb_jmp_cache + 0xea4) = local_34;
          local_68 = cs[1].tb_jmp_cache[0x1d1];
          pTStack_60 = cs[1].tb_jmp_cache[0x1d2];
          cs[1].tb_jmp_cache[0x1d1] = local_b0;
          cs[1].tb_jmp_cache[0x1d2] = local_b8;
          r4k_helper_tlbwr_mips(env);
          mmu_idx = local_74;
          access_type = local_94;
          *(uint *)(cs[1].tb_jmp_cache + 0x1e5) = uVar5;
          *(undefined4 *)((long)cs[1].tb_jmp_cache + 0xea4) = uVar2;
          cs[1].tb_jmp_cache[0x1d1] = local_68;
          cs[1].tb_jmp_cache[0x1d2] = pTStack_60;
          puVar1 = (uint *)((long)cs[1].tb_jmp_cache + 0x358c);
          *puVar1 = *puVar1 | local_dc;
          tlb_error = get_physical_address
                                (env,(hwaddr *)local_88,&local_c4,real_address,local_94,local_74,
                                 in_stack_ffffffffffffff18);
          goto joined_r0x00755c24;
        }
      }
    }
LAB_00755819:
    local_dc = uVar5;
    puVar1 = (uint *)((long)cs[1].tb_jmp_cache + 0x358c);
    *puVar1 = *puVar1 | uVar18;
    env = local_d8;
    access_type = local_94;
  }
  else {
joined_r0x00755c24:
    if (tlb_error == 0) {
      tlb_set_page_mips(cs,real_address & 0xfffff000,(ulong)(local_88[0] & 0xfffff000),local_c4,
                        mmu_idx,0x1000);
      return true;
    }
  }
LAB_0075582a:
  if ((char)local_70 != '\0') {
    return false;
  }
  raise_mmu_exception(env,real_address,access_type,tlb_error);
  do_raise_exception_err_mips(env,cs->exception_index,*(int *)(cs[1].tb_jmp_cache + 0x6b1),retaddr);
}

Assistant:

bool mips_cpu_tlb_fill(CPUState *cs, vaddr address, int size,
                       MMUAccessType access_type, int mmu_idx,
                       bool probe, uintptr_t retaddr)
{
    MIPSCPU *cpu = MIPS_CPU(cs);
    CPUMIPSState *env = &cpu->env;
    hwaddr physical;
    int prot;
    int mips_access_type;
    int ret = TLBRET_BADADDR;

    /* data access */
    /* XXX: put correct access by using cpu_restore_state() correctly */
    mips_access_type = ACCESS_INT;
    ret = get_physical_address(env, &physical, &prot, address,
                               access_type, mips_access_type, mmu_idx);
    switch (ret) {
    case TLBRET_MATCH:
        qemu_log_mask(CPU_LOG_MMU,
                      "%s address=%" VADDR_PRIx " physical " TARGET_FMT_plx
                      " prot %d\n", __func__, address, physical, prot);
        break;
    default:
        qemu_log_mask(CPU_LOG_MMU,
                      "%s address=%" VADDR_PRIx " ret %d\n", __func__, address,
                      ret);
        break;
    }
    if (ret == TLBRET_MATCH) {
        tlb_set_page(cs, address & TARGET_PAGE_MASK,
                     physical & TARGET_PAGE_MASK, prot,
                     mmu_idx, TARGET_PAGE_SIZE);
        return true;
    }
#if !defined(TARGET_MIPS64)
    if ((ret == TLBRET_NOMATCH) && (env->tlb->nb_tlb > 1)) {
        /*
         * Memory reads during hardware page table walking are performed
         * as if they were kernel-mode load instructions.
         */
        int mode = (env->hflags & MIPS_HFLAG_KSU);
        bool ret_walker;
        env->hflags &= ~MIPS_HFLAG_KSU;
        ret_walker = page_table_walk_refill(env, address, access_type, mmu_idx);
        env->hflags |= mode;
        if (ret_walker) {
            ret = get_physical_address(env, &physical, &prot, address,
                                       access_type, mips_access_type, mmu_idx);
            if (ret == TLBRET_MATCH) {
                tlb_set_page(cs, address & TARGET_PAGE_MASK,
                             physical & TARGET_PAGE_MASK, prot,
                             mmu_idx, TARGET_PAGE_SIZE);
                return true;
            }
        }
    }
#endif
    if (probe) {
        return false;
    }

    raise_mmu_exception(env, address, access_type, ret);
    do_raise_exception_err(env, cs->exception_index, env->error_code, retaddr);
}